

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void scroll_into_view(Am_Object *cls)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Am_Value *pAVar6;
  int iVar7;
  ushort uVar8;
  int cls_top;
  int cls_left;
  int local_3c;
  Am_Object local_38;
  Am_Object local_30;
  int local_24;
  
  uVar8 = (ushort)cls;
  pAVar6 = (Am_Value *)Am_Object::Get(uVar8,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar6);
  local_24 = iVar1;
  pAVar6 = (Am_Value *)Am_Object::Get(uVar8,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  local_3c = iVar2;
  Am_Object::Get_Object((ushort)&local_30,(ulong)cls);
  Am_Object::Get_Object((ushort)&local_38,0x110508);
  Am_Translate_Coordinates(&local_30,iVar1,iVar2,&local_38,&local_24,&local_3c);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  pAVar6 = (Am_Value *)Am_Object::Get(uVar8,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar6);
  iVar1 = iVar1 + local_3c;
  pAVar6 = (Am_Value *)Am_Object::Get(0x508,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get(0x508,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get(0x508,0x11e);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  if (local_3c < iVar2) {
    uVar5 = (iVar4 - iVar2) + local_3c;
  }
  else {
    iVar7 = iVar1 - (iVar3 + iVar2);
    if (iVar7 == 0 || iVar1 < iVar3 + iVar2) {
      return;
    }
    uVar5 = iVar4 + iVar7;
  }
  Am_Object::Set(0x508,0x11e,(ulong)uVar5);
  return;
}

Assistant:

void
scroll_into_view(Am_Object cls)
{
  int cls_left = cls.Get(Am_LEFT);
  int cls_top = cls.Get(Am_TOP);
  Am_Translate_Coordinates(cls.Get_Owner(), cls_left, cls_top,
                           class_scroller.Get_Owner(), cls_left, cls_top);

  int cls_height = cls.Get(Am_HEIGHT);
  int cls_bottom = cls_top + cls_height;

  int scroller_top = class_scroller.Get(Am_TOP);
  int scroller_height = class_scroller.Get(Am_HEIGHT);
  int scroller_bottom = scroller_top + scroller_height;

  int scroller_y_offset = class_scroller.Get(Am_Y_OFFSET);

  if (cls_top < scroller_top)
    class_scroller.Set(Am_Y_OFFSET,
                       scroller_y_offset - (scroller_top - cls_top));
  else if (cls_bottom > scroller_bottom)
    class_scroller.Set(Am_Y_OFFSET,
                       scroller_y_offset + (cls_bottom - scroller_bottom));
}